

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O0

void __thiscall Coverage_unitsItem_Test::TestBody(Coverage_unitsItem_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_140 [2];
  AssertHelper local_120 [8];
  Message local_118 [15];
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_d8 [8];
  Message local_d0 [15];
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_a0 [8];
  UnitsItemPtr unitsItemInvalid;
  UnitsItemPtr unitsItemValid;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  UnitsPtr units;
  Coverage_unitsItem_Test *this_local;
  
  units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"units",&local_41);
  libcellml::Units::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"second",
             (allocator<char> *)
             ((long)&unitsItemValid.
                     super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar3);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&unitsItemValid.
                     super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  this_00 = &unitsItemInvalid.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  libcellml::UnitsItem::create((shared_ptr *)this_00,(ulong)local_20);
  this_01 = &gtest_ar_.message_;
  std::shared_ptr<libcellml::Units>::shared_ptr
            ((shared_ptr<libcellml::Units> *)this_01,(nullptr_t)0x0);
  libcellml::UnitsItem::create((shared_ptr *)local_a0,(ulong)this_01);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)this_01);
  std::__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  bVar1 = libcellml::UnitsItem::isValid();
  local_c1 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar2) {
    testing::Message::Message(local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_c0,"unitsItemValid->isValid()","false"
              );
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/coverage/coverage.cpp"
               ,0xb0,pcVar4);
    testing::internal::AssertHelper::operator=(local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  std::__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_a0);
  bVar1 = libcellml::UnitsItem::isValid();
  local_109 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar2) {
    testing::Message::Message(local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_140,local_108,"unitsItemInvalid->isValid()","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/coverage/coverage.cpp"
               ,0xb1,pcVar4);
    testing::internal::AssertHelper::operator=(local_120,local_118);
    testing::internal::AssertHelper::~AssertHelper(local_120);
    std::__cxx11::string::~string((string *)local_140);
    testing::Message::~Message(local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr((shared_ptr<libcellml::UnitsItem> *)local_a0);
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr
            ((shared_ptr<libcellml::UnitsItem> *)
             &unitsItemInvalid.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_20);
  return;
}

Assistant:

TEST(Coverage, unitsItem)
{
    auto units = libcellml::Units::create("units");
    units->addUnit("second");

    auto unitsItemValid = libcellml::UnitsItem::create(units, 0);
    auto unitsItemInvalid = libcellml::UnitsItem::create(nullptr, 0);

    EXPECT_TRUE(unitsItemValid->isValid());
    EXPECT_FALSE(unitsItemInvalid->isValid());
}